

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

string * __thiscall
Json::parse_string(string *__return_storage_ptr__,Json *this,string *str,size_t *pos)

{
  char *pcVar1;
  size_t *pos_local;
  string *str_local;
  Json *this_local;
  string *res;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  *pos = *pos + 1;
  while (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar1 != '\"') {
    std::__cxx11::string::operator[]((ulong)str);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    *pos = *pos + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Json::parse_string(const std::string str, size_t &pos) const {
    std::string res;
    pos++;
    while (str[pos] != '"') {
        res.push_back(str[pos]);
        pos++;
    }
    return res;
}